

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMNodeImpl::setTextContent(DOMNodeImpl *this,XMLCh *textContent)

{
  bool bVar1;
  int iVar2;
  DOMNode *pDVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined8 uVar4;
  DOMException *pDVar5;
  DOMDocument *pDVar6;
  MemoryManager *local_118;
  DOMDocumentImpl *local_108;
  DOMNode *local_f8;
  MemoryManager *local_e8;
  MemoryManager *local_d8;
  DOMDocumentImpl *local_c8;
  DOMNode *local_b8;
  MemoryManager *local_a8;
  long *local_98;
  MemoryManager *local_88;
  DOMDocumentImpl *local_78;
  DOMNode *local_68;
  MemoryManager *local_58;
  long local_38;
  DOMNode *current;
  DOMNode *thisNode;
  XMLCh *textContent_local;
  DOMNodeImpl *this_local;
  
  pDVar3 = getContainingNode(this);
  iVar2 = (*pDVar3->_vptr_DOMNode[4])();
  if (iVar2 != 1) {
    if (iVar2 - 2U < 3) {
LAB_00304847:
      bVar1 = isReadOnly(this);
      if (!bVar1) {
        (*pDVar3->_vptr_DOMNode[0x13])(pDVar3,textContent);
        return;
      }
      pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
      if (this == (DOMNodeImpl *)0x0) {
        local_a8 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        pDVar6 = getOwnerDocument(this);
        if (pDVar6 == (DOMDocument *)0x0) {
          local_b8 = (DOMNode *)0x0;
        }
        else {
          local_b8 = &pDVar6[-1].super_DOMNode;
        }
        if (local_b8 == (DOMNode *)0x0) {
          local_d8 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          pDVar6 = getOwnerDocument(this);
          if (pDVar6 == (DOMDocument *)0x0) {
            local_c8 = (DOMDocumentImpl *)0x0;
          }
          else {
            local_c8 = (DOMDocumentImpl *)&pDVar6[-1].super_DOMNode;
          }
          local_d8 = DOMDocumentImpl::getMemoryManager(local_c8);
        }
        local_a8 = local_d8;
      }
      DOMException::DOMException(pDVar5,7,0,local_a8);
      __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
    }
    if (1 < iVar2 - 5U) {
      if (iVar2 - 7U < 2) goto LAB_00304847;
      if (iVar2 - 9U < 2) {
        return;
      }
      if (iVar2 != 0xb) {
        if (iVar2 == 0xc) {
          return;
        }
        pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
        if (this == (DOMNodeImpl *)0x0) {
          local_e8 = XMLPlatformUtils::fgMemoryManager;
        }
        else {
          pDVar6 = getOwnerDocument(this);
          if (pDVar6 == (DOMDocument *)0x0) {
            local_f8 = (DOMNode *)0x0;
          }
          else {
            local_f8 = &pDVar6[-1].super_DOMNode;
          }
          if (local_f8 == (DOMNode *)0x0) {
            local_118 = XMLPlatformUtils::fgMemoryManager;
          }
          else {
            pDVar6 = getOwnerDocument(this);
            if (pDVar6 == (DOMDocument *)0x0) {
              local_108 = (DOMDocumentImpl *)0x0;
            }
            else {
              local_108 = (DOMDocumentImpl *)&pDVar6[-1].super_DOMNode;
            }
            local_118 = DOMDocumentImpl::getMemoryManager(local_108);
          }
          local_e8 = local_118;
        }
        DOMException::DOMException(pDVar5,9,0,local_e8);
        __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
      }
    }
  }
  bVar1 = isReadOnly(this);
  if (!bVar1) {
    iVar2 = (*pDVar3->_vptr_DOMNode[7])();
    local_38 = CONCAT44(extraout_var,iVar2);
    while (local_38 != 0) {
      (*pDVar3->_vptr_DOMNode[0x10])(pDVar3,local_38);
      iVar2 = (*pDVar3->_vptr_DOMNode[7])();
      local_38 = CONCAT44(extraout_var_00,iVar2);
    }
    if (textContent != (XMLCh *)0x0) {
      iVar2 = (*pDVar3->_vptr_DOMNode[0xc])();
      if (CONCAT44(extraout_var_01,iVar2) == 0) {
        local_98 = (long *)0x0;
      }
      else {
        local_98 = (long *)(CONCAT44(extraout_var_01,iVar2) + -8);
      }
      uVar4 = (**(code **)(*local_98 + 0x1f0))(local_98,textContent);
      (*pDVar3->_vptr_DOMNode[0x11])(pDVar3,uVar4);
    }
    return;
  }
  pDVar5 = (DOMException *)__cxa_allocate_exception(0x28);
  if (this == (DOMNodeImpl *)0x0) {
    local_58 = XMLPlatformUtils::fgMemoryManager;
  }
  else {
    pDVar6 = getOwnerDocument(this);
    if (pDVar6 == (DOMDocument *)0x0) {
      local_68 = (DOMNode *)0x0;
    }
    else {
      local_68 = &pDVar6[-1].super_DOMNode;
    }
    if (local_68 == (DOMNode *)0x0) {
      local_88 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar6 = getOwnerDocument(this);
      if (pDVar6 == (DOMDocument *)0x0) {
        local_78 = (DOMDocumentImpl *)0x0;
      }
      else {
        local_78 = (DOMDocumentImpl *)&pDVar6[-1].super_DOMNode;
      }
      local_88 = DOMDocumentImpl::getMemoryManager(local_78);
    }
    local_58 = local_88;
  }
  DOMException::DOMException(pDVar5,7,0,local_58);
  __cxa_throw(pDVar5,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMNodeImpl::setTextContent(const XMLCh* textContent) {
    DOMNode *thisNode = getContainingNode();
    switch (thisNode->getNodeType())
    {
        case DOMNode::ELEMENT_NODE:
        case DOMNode::ENTITY_NODE:
        case DOMNode::ENTITY_REFERENCE_NODE:
        case DOMNode::DOCUMENT_FRAGMENT_NODE:
            {
                if (isReadOnly())
                  throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);

                // Remove all childs
                DOMNode* current = thisNode->getFirstChild();
                while (current != NULL)
                {
                    thisNode->removeChild(current);
                    current = thisNode->getFirstChild();
                }
                if (textContent != NULL)
                {
                    // Add textnode containing data
                    current = ((DOMDocumentImpl*)thisNode->getOwnerDocument())->createTextNode(textContent);
                    thisNode->appendChild(current);
                }
            }
            break;

        case DOMNode::ATTRIBUTE_NODE:
        case DOMNode::TEXT_NODE:
        case DOMNode::CDATA_SECTION_NODE:
        case DOMNode::COMMENT_NODE:
        case DOMNode::PROCESSING_INSTRUCTION_NODE:
            if (isReadOnly())
                throw DOMException(DOMException::NO_MODIFICATION_ALLOWED_ERR, 0, GetDOMNodeMemoryManager);

            thisNode->setNodeValue(textContent);
            break;

        case DOMNode::DOCUMENT_NODE:
        case DOMNode::DOCUMENT_TYPE_NODE:
        case DOMNode::NOTATION_NODE:
            break;

        default:
            throw DOMException(DOMException::NOT_SUPPORTED_ERR, 0, GetDOMNodeMemoryManager);
    }
}